

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall argparse::Argument::validate(Argument *this)

{
  byte bVar1;
  pointer pbVar2;
  size_t sVar3;
  pointer paVar4;
  pointer paVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  long lVar8;
  stringstream stream;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  lVar8 = (long)this->mNumArgs;
  if (-1 < lVar8) {
    bVar1 = this->field_0xcc;
    if ((bVar1 & 1) == 0) {
      if (((long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4 != lVar8) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        sVar3 = (this->mUsedName)._M_len;
        if (sVar3 != 0) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_198,(this->mUsedName)._M_str,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        }
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," argument(s) expected. ",0x17);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," provided.",10);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,asStack_1c8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((bVar1 & 8) == 0) {
      if (((bVar1 & 2) != 0) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        pbVar2 = (this->mNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": required.",0xb);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,asStack_1c8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      paVar4 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar5 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((((bVar1 & 4) == 0) && ((long)paVar4 - (long)paVar5 >> 4 != lVar8)) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(this->mUsedName)._M_str,(this->mUsedName)._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": expected ",0xb);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," argument(s). ",0xe);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," provided.",10);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,asStack_1c8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (paVar4 == paVar5 && (~bVar1 & 10) == 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(this->mUsedName)._M_str,(this->mUsedName)._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": no value provided.",0x14);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,asStack_1c8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

auto maybe_nargs() const -> std::optional<std::size_t> {
            if (mNumArgs < 0)
                return std::nullopt;
            else
                return static_cast<std::size_t>(mNumArgs);
        }